

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool,false,false>
               (date_t *ldata,interval_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  uint uVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  ulong uVar4;
  timestamp_t tVar5;
  timestamp_t *ptVar6;
  timestamp_t *ptVar7;
  idx_t iVar8;
  timestamp_t *ptVar9;
  ulong uVar10;
  int64_t *piVar11;
  idx_t iVar12;
  ulong uVar13;
  ulong uVar14;
  interval_t iVar15;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  interval_t interval;
  interval_t interval_00;
  int64_t *local_78;
  timestamp_t *extraout_RDX;
  timestamp_t *extraout_RDX_00;
  timestamp_t *extraout_RDX_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      local_78 = &rdata->micros;
      iVar12 = 0;
      iVar8 = count;
      ptVar9 = result_data;
      do {
        uVar1 = ldata[iVar12].days;
        iVar15.micros = (int64_t)ptVar9;
        iVar15._0_8_ = *local_78;
        iVar15 = Interval::Invert(*(Interval **)(local_78 + -1),iVar15);
        right_01._0_8_ = iVar15.micros;
        right_01.micros = iVar8;
        tVar5 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                          ((AddOperator *)(ulong)uVar1,(date_t)iVar15.months,right_01);
        result_data[iVar12].value = tVar5.value;
        iVar12 = iVar12 + 1;
        local_78 = local_78 + 2;
        ptVar9 = extraout_RDX_01;
      } while (count != iVar12);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar10 = 0;
    ptVar6 = (timestamp_t *)0x0;
    ptVar9 = result_data;
    do {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar14 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar14 = count;
        }
LAB_0146b12f:
        uVar4 = uVar10;
        if (uVar10 < uVar14) {
          piVar11 = &rdata[uVar10].micros;
          ptVar7 = ptVar6;
          do {
            uVar1 = ldata[uVar10].days;
            interval.micros = (int64_t)ptVar9;
            interval._0_8_ = *piVar11;
            iVar15 = Interval::Invert(*(Interval **)(piVar11 + -1),interval);
            right._0_8_ = iVar15.micros;
            right.micros = (int64_t)ptVar7;
            tVar5 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                              ((AddOperator *)(ulong)uVar1,(date_t)iVar15.months,right);
            result_data[uVar10].value = tVar5.value;
            uVar10 = uVar10 + 1;
            piVar11 = piVar11 + 2;
            ptVar9 = extraout_RDX;
            uVar4 = uVar14;
          } while (uVar14 != uVar10);
        }
      }
      else {
        uVar3 = puVar2[(long)ptVar6];
        uVar14 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar14 = count;
        }
        uVar4 = uVar14;
        if (uVar3 != 0) {
          if (uVar3 == 0xffffffffffffffff) goto LAB_0146b12f;
          uVar4 = uVar10;
          if (uVar10 < uVar14) {
            piVar11 = &rdata[uVar10].micros;
            uVar13 = 0;
            ptVar7 = ptVar6;
            do {
              if ((uVar3 >> (uVar13 & 0x3f) & 1) != 0) {
                uVar1 = ldata[uVar10 + uVar13].days;
                interval_00.micros = (int64_t)ptVar9;
                interval_00._0_8_ = *piVar11;
                iVar15 = Interval::Invert(*(Interval **)(piVar11 + -1),interval_00);
                right_00._0_8_ = iVar15.micros;
                right_00.micros = (int64_t)ptVar7;
                tVar5 = AddOperator::
                        Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                                  ((AddOperator *)(ulong)uVar1,(date_t)iVar15.months,right_00);
                (result_data + uVar10)[uVar13].value = tVar5.value;
                ptVar7 = result_data + uVar10;
                ptVar9 = extraout_RDX_00;
              }
              uVar13 = uVar13 + 1;
              piVar11 = piVar11 + 2;
              uVar4 = uVar14;
            } while (uVar14 - uVar10 != uVar13);
          }
        }
      }
      uVar10 = uVar4;
      ptVar6 = (timestamp_t *)((long)&ptVar6->value + 1);
    } while (ptVar6 != (timestamp_t *)(count + 0x3f >> 6));
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}